

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.h
# Opt level: O3

void __thiscall
google::protobuf::util::converter::JsonStreamParser::SkipWhitespace(JsonStreamParser *this)

{
  byte bVar1;
  long lVar2;
  
  lVar2 = (this->p_).length_;
  while ((lVar2 != 0 && ((bVar1 = *(this->p_).ptr_, bVar1 - 9 < 5 || (bVar1 == 0x20))))) {
    Advance(this);
    lVar2 = (this->p_).length_;
  }
  return;
}

Assistant:

bool empty() const { return length_ == 0; }